

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O2

PVIPString * PVIP_string_new(void)

{
  PVIPString *pPVar1;
  char *pcVar2;
  
  pPVar1 = (PVIPString *)calloc(1,0x18);
  if (pPVar1 != (PVIPString *)0x0) {
    pPVar1->buflen = 0x100;
    pcVar2 = (char *)malloc(0x100);
    pPVar1->buf = pcVar2;
    if (pcVar2 != (char *)0x0) {
      return pPVar1;
    }
  }
  fwrite("[PVIP] Cannot allocate memory\n",0x1e,1,_stderr);
  abort();
}

Assistant:

PVIPString *PVIP_string_new() {
    PVIPString *str = malloc(sizeof(PVIPString));
    if (!str) {
        fprintf(stderr, "[PVIP] Cannot allocate memory\n");
        abort();
    }
    memset(str, 0, sizeof(PVIPString));
    str->len    = 0;
    str->buflen = 256;
    str->buf    = malloc(str->buflen);
    if (!str->buf) {
        fprintf(stderr, "[PVIP] Cannot allocate memory\n");
        abort();
    }
    return str;
}